

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O0

vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
nivalis::diff_ast(AST *ast,uint64_t var_addr,Environment *env)

{
  bool bVar1;
  reference pvVar2;
  Differentiator *in_RDI;
  Differentiator diff;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *dast;
  uint32_t in_stack_00000f5c;
  ASTNode **in_stack_00000f60;
  Differentiator *in_stack_00000f68;
  Differentiator *this;
  undefined8 in_stack_fffffffffffffe50;
  anon_union_8_3_343d95dd_for_ASTNode_1 in_stack_fffffffffffffe58;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_stack_fffffffffffffe60
  ;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_stack_fffffffffffffe90
  ;
  Environment *in_stack_fffffffffffffe98;
  uint64_t in_stack_fffffffffffffea0;
  AST *in_stack_fffffffffffffea8;
  Differentiator *in_stack_fffffffffffffeb0;
  
  this = in_RDI;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)0x134fd1);
  anon_unknown_3::Differentiator::Differentiator
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  bVar1 = anon_unknown_3::Differentiator::diff
                    (in_stack_00000f68,in_stack_00000f60,in_stack_00000f5c);
  if (!bVar1) {
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::resize
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58.ref);
    Expr::ASTNode::ASTNode((ASTNode *)&stack0xfffffffffffffe50,null);
    pvVar2 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
             operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_RDI,0);
    pvVar2->opcode = (uint32_t)in_stack_fffffffffffffe50;
    *(int *)&pvVar2->field_0x4 = SUB84(in_stack_fffffffffffffe50,4);
    (pvVar2->field_1).ref = (uint64_t)in_stack_fffffffffffffe58;
  }
  anon_unknown_3::Differentiator::~Differentiator(this);
  return (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)this;
}

Assistant:

std::vector<Expr::ASTNode> diff_ast(const Expr::AST& ast,
        uint64_t var_addr, Environment& env) {
    std::vector<Expr::ASTNode> dast;
    Differentiator diff(ast, var_addr, env, dast);
    if (!diff.diff()) {
        dast.resize(1);
        dast[0] = OpCode::null;
    }
    return dast;
}